

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O0

HighsStatus
solveLpIpx(HighsOptions *options,HighsTimer *timer,HighsLp *lp,HighsBasis *highs_basis,
          HighsSolution *highs_solution,HighsModelStatus *model_status,HighsInfo *highs_info,
          HighsCallback *callback)

{
  double dVar1;
  Parameters new_parameters;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  Int IVar5;
  Int IVar6;
  HighsStatus HVar7;
  double *pdVar8;
  HighsLp *lp_00;
  uint *puVar9;
  vector<char,_std::allocator<char>_> *pvVar10;
  vector<double,_std::allocator<double>_> *rhs_00;
  HighsOptions *options_00;
  int *piVar11;
  Info *ipx_info_00;
  string *message;
  HighsOptions *options_01;
  byte bVar12;
  byte *in_RCX;
  size_t __nbytes;
  long lVar13;
  void *__buf;
  HighsTimer *in_RSI;
  pointer *__dest;
  long in_RDI;
  undefined8 *puVar14;
  undefined1 *in_R8;
  HighsModelStatus *in_R9;
  byte bVar15;
  double extraout_XMM0_Qa;
  HighsInfo *in_stack_00000008;
  HighsStatus return_status;
  HighsModelStatus local_model_status_1;
  HighsStatus status;
  Int errflag;
  IpxSolution ipx_solution;
  bool imprecise_solution;
  bool have_basic_solution;
  HighsModelStatus local_model_status;
  HighsStatus crossover_return_status;
  HighsStatus ipm_return_status;
  bool ipm_status;
  HighsStatus solve_return_status;
  Info ipx_info;
  bool report_solve_data;
  Int solve_status;
  Int load_status;
  vector<char,_std::allocator<char>_> constraint_type;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> Av;
  vector<double,_std::allocator<double>_> col_ub;
  vector<double,_std::allocator<double>_> col_lb;
  vector<double,_std::allocator<double>_> objective;
  vector<int,_std::allocator<int>_> Ai;
  vector<int,_std::allocator<int>_> Ap;
  double offset;
  Int num_row;
  Int num_col;
  Parameters parameters;
  LpSolver lps;
  HighsCallback *in_stack_ffffffffffffec48;
  Info *ipx_info_01;
  undefined4 in_stack_ffffffffffffec50;
  HighsModelStatus HVar16;
  undefined4 in_stack_ffffffffffffec54;
  undefined4 uVar17;
  undefined4 in_stack_ffffffffffffec58;
  undefined4 in_stack_ffffffffffffec5c;
  int value;
  undefined8 in_stack_ffffffffffffec60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec68;
  undefined7 in_stack_ffffffffffffec70;
  undefined7 uVar18;
  undefined1 in_stack_ffffffffffffec77;
  undefined1 status_error;
  undefined4 in_stack_ffffffffffffec78;
  Int in_stack_ffffffffffffec7c;
  double *in_stack_ffffffffffffec80;
  LpSolver *in_stack_ffffffffffffec88;
  double *in_stack_ffffffffffffec90;
  double in_stack_ffffffffffffec98;
  undefined4 in_stack_ffffffffffffeca0;
  Int in_stack_ffffffffffffeca4;
  LpSolver *in_stack_ffffffffffffeca8;
  undefined1 in_stack_ffffffffffffecb0 [32];
  undefined4 in_stack_ffffffffffffecd0;
  undefined1 ipm_status_00;
  Int in_stack_ffffffffffffecd4;
  HighsOptions *in_stack_ffffffffffffecd8;
  double *in_stack_ffffffffffffece0;
  double *in_stack_ffffffffffffece8;
  char *in_stack_ffffffffffffecf0;
  undefined1 in_stack_ffffffffffffecf8 [68];
  undefined4 in_stack_ffffffffffffed3c;
  bool local_1293;
  HighsStatus in_stack_ffffffffffffedd8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffee08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffee10;
  double *in_stack_ffffffffffffee18;
  undefined4 in_stack_ffffffffffffee20;
  uint num_row_00;
  undefined4 in_stack_ffffffffffffee24;
  Int *in_stack_ffffffffffffee28;
  undefined4 in_stack_ffffffffffffee30;
  uint uVar19;
  undefined4 in_stack_ffffffffffffee34;
  uint uVar20;
  LpSolver *lps_00;
  HighsModelStatus model_status_00;
  vector<int,_std::allocator<int>_> *Ap_00;
  HighsSolution *highs_solution_00;
  HighsOptions *options_02;
  Info *ipx_info_02;
  HighsStatus local_1170;
  HighsBasis *in_stack_ffffffffffffeed0;
  IpxSolution *in_stack_ffffffffffffeed8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffeee0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffeee8;
  HighsLp *in_stack_ffffffffffffeef0;
  HighsLogOptions *in_stack_ffffffffffffeef8;
  HighsSolution *in_stack_ffffffffffffef10;
  allocator local_10c1;
  string local_10c0 [24];
  HighsOptions *in_stack_ffffffffffffef58;
  Info *in_stack_ffffffffffffef60;
  LpSolver *in_stack_ffffffffffffef68;
  allocator local_1071;
  string local_1070 [32];
  undefined4 local_1050;
  allocator local_1049;
  string local_1048 [32];
  HighsStatus local_1028;
  HighsStatus local_1024;
  undefined1 local_101d;
  HighsStatus local_101c;
  int local_1014;
  int local_1010;
  int local_f58;
  int local_f40;
  byte local_e45;
  Int local_e44;
  int local_e40;
  Int local_e3c;
  undefined1 local_e38 [96];
  vector<char,_std::allocator<char>_> local_dd8;
  HighsSolution local_d90 [2];
  Parameters local_c68;
  Info local_b78 [6];
  HighsModelStatus *local_48;
  byte *local_38;
  HighsTimer *local_28;
  long local_20;
  HighsStatus local_14;
  
  bVar15 = 0;
  *in_RCX = 0;
  *in_R8 = 0;
  in_R8[1] = 0;
  local_48 = in_R9;
  local_38 = in_RCX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  resetModelStatusAndHighsInfo(in_R9,in_stack_00000008);
  ipx::LpSolver::LpSolver((LpSolver *)CONCAT44(in_stack_ffffffffffffecd4,in_stack_ffffffffffffecd0))
  ;
  ipx::Parameters::Parameters(&local_c68);
  bVar12 = (*(byte *)(local_20 + 0x1d9) ^ 0xff) & 1;
  __nbytes = (size_t)bVar12;
  local_c68.super_ipx_parameters.display =
       (ipxint)(((*(byte *)(local_20 + 0x1d8) ^ 0xff) & 1) == 0 && bVar12 == 0);
  local_c68.super_ipx_parameters.debug = 0;
  if (*(int *)(local_20 + 0x208) == 2) {
    local_c68.super_ipx_parameters.debug = 0;
  }
  else if (*(int *)(local_20 + 0x208) == 1) {
    local_c68.super_ipx_parameters.debug = 2;
  }
  else if (*(int *)(local_20 + 0x208) == 3) {
    local_c68.super_ipx_parameters.debug = 4;
  }
  local_c68.super_ipx_parameters.highs_logging = true;
  local_c68.super_ipx_parameters.timeless_log = (bool)(*(byte *)(local_20 + 0x1da) & 1);
  local_c68.super_ipx_parameters.log_options = (HighsLogOptions *)(local_20 + 0x380);
  if (*(int *)(local_20 + 0x224) == 1) {
    local_c68.super_ipx_parameters.dualize = 1;
  }
  else if (*(int *)(local_20 + 0x224) == -1) {
    local_c68.super_ipx_parameters.dualize = 0;
  }
  else if (*(int *)(local_20 + 0x224) == 2) {
    local_c68.super_ipx_parameters.dualize = -1;
  }
  else if (*(int *)(local_20 + 0x224) == 3) {
    local_c68.super_ipx_parameters.dualize = -2;
  }
  pdVar8 = std::min<double>((double *)(local_20 + 0x118),(double *)(local_20 + 0x120));
  local_c68.super_ipx_parameters.ipm_feasibility_tol = *pdVar8;
  local_c68.super_ipx_parameters.ipm_optimality_tol = *(double *)(local_20 + 0x128);
  local_c68.super_ipx_parameters.start_crossover_tol = *(double *)(local_20 + 0x2a8);
  local_c68.super_ipx_parameters.analyse_basis_data =
       SUB41((*(uint *)(local_20 + 0x160) & 0x10) >> 4,0);
  dVar1 = *(double *)(local_20 + 0x88);
  HighsTimer::read(local_28,0,__buf,__nbytes);
  local_c68.super_ipx_parameters.time_limit = dVar1 - extraout_XMM0_Qa;
  local_c68.super_ipx_parameters.ipm_maxiter =
       *(int *)(local_20 + 0x1dc) - (in_stack_00000008->super_HighsInfoStruct).ipm_iteration_count;
  if ((*(byte *)(local_20 + 0x2b3) & 1) == 0) {
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffec77,in_stack_ffffffffffffec70),
                            in_stack_ffffffffffffec68);
    if (_Var3) {
      local_c68.super_ipx_parameters.run_crossover = 1;
    }
    else {
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffec77,in_stack_ffffffffffffec70),
                              in_stack_ffffffffffffec68);
      if (_Var3) {
        local_c68.super_ipx_parameters.run_crossover = 0;
      }
      else {
        local_c68.super_ipx_parameters.run_crossover = -1;
      }
    }
  }
  else {
    local_c68.super_ipx_parameters.run_crossover = 0;
  }
  if (local_c68.super_ipx_parameters.run_crossover == 0) {
    local_c68.super_ipx_parameters.start_crossover_tol = -1.0;
  }
  local_c68.super_ipx_parameters.run_centring = *(byte *)(local_20 + 0x2b3) & 1;
  local_c68.super_ipx_parameters.max_centring_steps = *(ipxint *)(local_20 + 0x2b4);
  local_c68.super_ipx_parameters.centring_ratio_tolerance = *(double *)(local_20 + 0x2b8);
  __dest = &local_d90[0].col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  memcpy(__dest,&local_c68,0xf0);
  puVar14 = (undefined8 *)&stack0xffffffffffffec48;
  for (lVar13 = 0x1e; lVar13 != 0; lVar13 = lVar13 + -1) {
    *puVar14 = *__dest;
    __dest = __dest + (ulong)bVar15 * -2 + 1;
    puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
  }
  new_parameters.super_ipx_parameters._4_4_ = in_stack_ffffffffffffec54;
  new_parameters.super_ipx_parameters.display = in_stack_ffffffffffffec50;
  new_parameters.super_ipx_parameters.logfile._0_4_ = in_stack_ffffffffffffec58;
  new_parameters.super_ipx_parameters.logfile._4_4_ = in_stack_ffffffffffffec5c;
  new_parameters.super_ipx_parameters.print_interval = (double)in_stack_ffffffffffffec60;
  new_parameters.super_ipx_parameters.time_limit = (double)in_stack_ffffffffffffec68;
  new_parameters.super_ipx_parameters._32_7_ = in_stack_ffffffffffffec70;
  new_parameters.super_ipx_parameters.dualize._3_1_ = in_stack_ffffffffffffec77;
  new_parameters.super_ipx_parameters.scale = in_stack_ffffffffffffec78;
  new_parameters.super_ipx_parameters.ipm_maxiter = in_stack_ffffffffffffec7c;
  new_parameters.super_ipx_parameters.ipm_feasibility_tol = (double)in_stack_ffffffffffffec80;
  new_parameters.super_ipx_parameters.ipm_optimality_tol = (double)in_stack_ffffffffffffec88;
  new_parameters.super_ipx_parameters.ipm_drop_primal = (double)in_stack_ffffffffffffec90;
  new_parameters.super_ipx_parameters.ipm_drop_dual = in_stack_ffffffffffffec98;
  new_parameters.super_ipx_parameters.kkt_tol._0_4_ = in_stack_ffffffffffffeca0;
  new_parameters.super_ipx_parameters.kkt_tol._4_4_ = in_stack_ffffffffffffeca4;
  new_parameters.super_ipx_parameters._88_8_ = in_stack_ffffffffffffeca8;
  new_parameters.super_ipx_parameters.dependency_tol = (double)in_stack_ffffffffffffecb0._0_8_;
  new_parameters.super_ipx_parameters.volume_tol = (double)in_stack_ffffffffffffecb0._8_8_;
  new_parameters.super_ipx_parameters.rows_per_slice = in_stack_ffffffffffffecb0._16_4_;
  new_parameters.super_ipx_parameters.maxskip_updates = in_stack_ffffffffffffecb0._20_4_;
  new_parameters.super_ipx_parameters.lu_kernel = in_stack_ffffffffffffecb0._24_4_;
  new_parameters.super_ipx_parameters._124_4_ = in_stack_ffffffffffffecb0._28_4_;
  new_parameters.super_ipx_parameters.lu_pivottol._0_4_ = in_stack_ffffffffffffecd0;
  new_parameters.super_ipx_parameters.lu_pivottol._4_4_ = in_stack_ffffffffffffecd4;
  new_parameters.super_ipx_parameters._136_8_ = in_stack_ffffffffffffecd8;
  new_parameters.super_ipx_parameters.start_crossover_tol = (double)in_stack_ffffffffffffece0;
  new_parameters.super_ipx_parameters.pfeasibility_tol = (double)in_stack_ffffffffffffece8;
  new_parameters.super_ipx_parameters.dfeasibility_tol = (double)in_stack_ffffffffffffecf0;
  new_parameters.super_ipx_parameters._168_68_ = in_stack_ffffffffffffecf8;
  new_parameters.super_ipx_parameters.log_options._4_4_ = in_stack_ffffffffffffed3c;
  ipx::LpSolver::SetParameters((LpSolver *)0x47abd0,new_parameters);
  ipx::LpSolver::SetCallback
            ((LpSolver *)CONCAT44(in_stack_ffffffffffffec54,in_stack_ffffffffffffec50),
             in_stack_ffffffffffffec48);
  highs_solution_00 = local_d90;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x47abfe);
  Ap_00 = (vector<int,_std::allocator<int>_> *)&stack0xfffffffffffff258;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x47ac13);
  ipx_info_02 = (Info *)&stack0xfffffffffffff240;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x47ac28);
  pvVar10 = &local_dd8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x47ac3d);
  options_02 = (HighsOptions *)(local_e38 + 0x48);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x47ac52);
  lps_00 = (LpSolver *)(local_e38 + 0x30);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x47ac67);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x47ac7c);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x47ac8c);
  uVar18 = SUB87(local_e38,0);
  status_error = (undefined1)((ulong)local_e38 >> 0x38);
  fillInIpxData((HighsLp *)CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30),
                in_stack_ffffffffffffee28,
                (Int *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
                in_stack_ffffffffffffee18,in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,
                (vector<double,_std::allocator<double>_> *)lps_00,Ap_00,
                (vector<int,_std::allocator<int>_> *)highs_solution_00,
                (vector<double,_std::allocator<double>_> *)options_02,
                (vector<double,_std::allocator<double>_> *)ipx_info_02,pvVar10);
  model_status_00 = (HighsModelStatus)Ap_00;
  lp_00 = (HighsLp *)(local_20 + 0x380);
  uVar19 = (uint)local_d90[0].col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_d90,
                              (long)(int)local_d90[0].col_dual.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start._4_4_);
  highsLogUser((HighsLogOptions *)lp_00,kInfo,"IPX model has %d rows, %d columns and %d nonzeros\n",
               (ulong)uVar19,
               (ulong)local_d90[0].col_dual.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,(ulong)*puVar9);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x47ada3);
  pvVar10 = (vector<char,_std::allocator<char>_> *)
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x47adb8);
  rhs_00 = (vector<double,_std::allocator<double>_> *)
           std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x47adcd);
  options_00 = (HighsOptions *)
               std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x47adf0);
  piVar11 = std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x47ae05);
  ipx_info_00 = (Info *)std::vector<double,_std::allocator<double>_>::data
                                  ((vector<double,_std::allocator<double>_> *)0x47ae1a);
  message = (string *)
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x47ae2f);
  options_01 = (HighsOptions *)
               std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x47ae3f);
  value = (int)((ulong)ipx_info_00 >> 0x20);
  HVar16 = (HighsModelStatus)piVar11;
  uVar17 = (undefined4)((ulong)piVar11 >> 0x20);
  IVar5 = ipx::LpSolver::LoadModel
                    (in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca4,in_stack_ffffffffffffec98,
                     in_stack_ffffffffffffec90,(double *)in_stack_ffffffffffffec88,
                     in_stack_ffffffffffffec80,in_stack_ffffffffffffec7c,
                     (Int *)CONCAT44(in_stack_ffffffffffffecd4,in_stack_ffffffffffffecd0),
                     (Int *)in_stack_ffffffffffffecd8,in_stack_ffffffffffffece0,
                     in_stack_ffffffffffffece8,in_stack_ffffffffffffecf0);
  ipm_status_00 = (undefined1)((uint)in_stack_ffffffffffffecd0 >> 0x18);
  local_e3c = IVar5;
  if (IVar5 == 0) {
    IVar6 = ipx::LpSolver::Solve(in_stack_ffffffffffffef68);
    local_e45 = (byte)((*(uint *)(local_20 + 0x160) & 2) >> 1);
    local_e44 = IVar6;
    ipx::LpSolver::GetInfo((LpSolver *)CONCAT44(uVar17,HVar16));
    num_row_00 = (uint)local_d90[0].col_dual.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    uVar20 = local_d90[0].col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_;
    if ((local_e45 & 1) != 0) {
      reportSolveData((HighsLogOptions *)CONCAT44(uVar17,HVar16),(Info *)options_00);
      num_row_00 = (uint)local_d90[0].col_dual.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      uVar20 = local_d90[0].col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
    }
    (in_stack_00000008->super_HighsInfoStruct).ipm_iteration_count =
         local_f58 + (in_stack_00000008->super_HighsInfoStruct).ipm_iteration_count;
    (in_stack_00000008->super_HighsInfoStruct).crossover_iteration_count =
         local_f40 + (in_stack_00000008->super_HighsInfoStruct).crossover_iteration_count;
    if ((local_e44 == 1000) ||
       (in_stack_ffffffffffffedd8 = reportIpxSolveStatus(options_00,0,0x47afe1),
       local_101c = in_stack_ffffffffffffedd8, in_stack_ffffffffffffedd8 != kError)) {
      local_101d = 1;
      local_1024 = reportIpxIpmCrossoverStatus
                             (in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd4,
                              (bool)ipm_status_00);
      local_101d = 0;
      local_1028 = reportIpxIpmCrossoverStatus
                             (in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd4,
                              (bool)ipm_status_00);
      if ((local_1024 == kError) || (local_1028 == kError)) {
        *local_48 = kSolveError;
        local_14 = kError;
        local_e40 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1048,"solve_status should be solved or stopped here but value is",
                   &local_1049);
        bVar4 = ipxStatusError((bool)status_error,options_01,message,value);
        std::__cxx11::string::~string(local_1048);
        std::allocator<char>::~allocator((allocator<char> *)&local_1049);
        if (bVar4) {
          local_14 = kError;
          local_e40 = 1;
        }
        else if (local_e44 == 0x3ed) {
          local_1050 = 0xf;
          ipx_info_01 = local_b78;
          HVar16 = kUnknown;
          getHighsNonVertexSolution
                    ((HighsOptions *)CONCAT44(uVar20,uVar19),lp_00,IVar5,num_row_00,rhs_00,pvVar10,
                     lps_00,model_status_00,highs_solution_00);
          bVar4 = illegalIpxStoppedCrossoverStatus(ipx_info_02,options_02);
          if (bVar4) {
            local_14 = kError;
            local_e40 = 1;
          }
          else if (local_1010 == 6) {
            *local_48 = kTimeLimit;
            local_14 = kWarning;
            local_e40 = 1;
          }
          else {
            bVar4 = illegalIpxStoppedIpmStatus
                              (ipx_info_00,(HighsOptions *)CONCAT44(IVar6,in_stack_ffffffffffffedd8)
                              );
            if (bVar4) {
              local_14 = kError;
              local_e40 = 1;
            }
            else if (local_1014 == 5) {
              *local_48 = kInterrupt;
              local_14 = kWarning;
              local_e40 = 1;
            }
            else if (local_1014 == 6) {
              *local_48 = kTimeLimit;
              local_14 = kWarning;
              local_e40 = 1;
            }
            else if (local_1014 == 7) {
              *local_48 = kIterationLimit;
              local_14 = kWarning;
              local_e40 = 1;
            }
            else {
              reportIpmNoProgress((HighsOptions *)CONCAT44(uVar17,HVar16),ipx_info_01);
              *local_48 = kUnknown;
              local_14 = kWarning;
              local_e40 = 1;
            }
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1070,"solve_status should be solved here but value is",&local_1071);
          bVar4 = ipxStatusError((bool)status_error,options_01,message,value);
          std::__cxx11::string::~string(local_1070);
          std::allocator<char>::~allocator((allocator<char> *)&local_1071);
          if (bVar4) {
            local_14 = kError;
            local_e40 = 1;
          }
          else {
            bVar4 = illegalIpxSolvedStatus(in_stack_ffffffffffffef60,in_stack_ffffffffffffef58);
            if (bVar4) {
              local_14 = kError;
              local_e40 = 1;
            }
            else if ((local_1014 == 3) || (local_1014 == 4)) {
              if (local_1014 == 3) {
                *local_48 = kInfeasible;
              }
              else if (local_1014 == 4) {
                *local_48 = kUnboundedOrInfeasible;
              }
              HVar16 = *local_48;
              getHighsNonVertexSolution
                        ((HighsOptions *)CONCAT44(uVar20,uVar19),lp_00,IVar5,num_row_00,rhs_00,
                         pvVar10,lps_00,model_status_00,highs_solution_00);
              local_14 = kOk;
              local_e40 = 1;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&stack0xffffffffffffef68,
                         "ipm status should be not run, optimal or imprecise but value is",
                         (allocator *)&stack0xffffffffffffef67);
              bVar4 = ipxStatusError((bool)status_error,options_01,message,value);
              std::__cxx11::string::~string((string *)&stack0xffffffffffffef68);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffef67);
              if (bVar4) {
                local_14 = kError;
                local_e40 = 1;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_10c0,
                           "crossover status should be not run, optimal or imprecise but value is",
                           &local_10c1);
                bVar4 = ipxStatusError((bool)status_error,options_01,message,value);
                std::__cxx11::string::~string(local_10c0);
                std::allocator<char>::~allocator((allocator<char> *)&local_10c1);
                if (bVar4) {
                  local_14 = kError;
                  local_e40 = 1;
                }
                else {
                  local_1293 = local_1010 == 2 || local_1014 == 2;
                  if (local_1010 == 0) {
                    HVar16 = (uint)local_1293 * 8 + kOptimal;
                    getHighsNonVertexSolution
                              ((HighsOptions *)CONCAT44(uVar20,uVar19),lp_00,IVar5,num_row_00,rhs_00
                               ,pvVar10,lps_00,model_status_00,highs_solution_00);
                  }
                  else {
                    IpxSolution::IpxSolution((IpxSolution *)CONCAT44(uVar17,HVar16));
                    std::vector<double,_std::allocator<double>_>::resize
                              ((vector<double,_std::allocator<double>_> *)
                               CONCAT17(status_error,uVar18),(size_type)options_01);
                    std::vector<double,_std::allocator<double>_>::resize
                              ((vector<double,_std::allocator<double>_> *)
                               CONCAT17(status_error,uVar18),(size_type)options_01);
                    std::vector<double,_std::allocator<double>_>::resize
                              ((vector<double,_std::allocator<double>_> *)
                               CONCAT17(status_error,uVar18),(size_type)options_01);
                    std::vector<double,_std::allocator<double>_>::resize
                              ((vector<double,_std::allocator<double>_> *)
                               CONCAT17(status_error,uVar18),(size_type)options_01);
                    std::vector<int,_std::allocator<int>_>::resize
                              ((vector<int,_std::allocator<int>_> *)CONCAT17(status_error,uVar18),
                               (size_type)options_01);
                    std::vector<int,_std::allocator<int>_>::resize
                              ((vector<int,_std::allocator<int>_> *)CONCAT17(status_error,uVar18),
                               (size_type)options_01);
                    std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x47b9da);
                    std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x47b9ef);
                    std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x47ba04);
                    std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x47ba19);
                    std::vector<int,_std::allocator<int>_>::data
                              ((vector<int,_std::allocator<int>_> *)0x47ba2e);
                    std::vector<int,_std::allocator<int>_>::data
                              ((vector<int,_std::allocator<int>_> *)0x47ba43);
                    IVar5 = ipx::LpSolver::GetBasicSolution
                                      (in_stack_ffffffffffffec88,in_stack_ffffffffffffec80,
                                       (double *)
                                       CONCAT44(in_stack_ffffffffffffec7c,in_stack_ffffffffffffec78)
                                       ,(double *)CONCAT17(status_error,uVar18),(double *)options_01
                                       ,(Int *)message,
                                       (Int *)CONCAT44(in_stack_ffffffffffffeca4,
                                                       in_stack_ffffffffffffeca0));
                    if (IVar5 == 0) {
                      HVar7 = ipxBasicSolutionToHighsBasicSolution
                                        (in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef0,
                                         in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
                                         in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                                         in_stack_ffffffffffffef10);
                      if (HVar7 == kOk) {
                        local_e40 = 0;
                      }
                      else {
                        highsLogUser((HighsLogOptions *)(local_20 + 0x380),kError,
                                     "Failed to convert IPX basic solution to Highs basic solution\n"
                                    );
                        local_14 = kError;
                        local_e40 = 1;
                      }
                    }
                    else {
                      highsLogUser((HighsLogOptions *)(local_20 + 0x380),kError,
                                   "IPX crossover getting basic solution: flag = %d\n");
                      local_14 = kError;
                      local_e40 = 1;
                    }
                    IpxSolution::~IpxSolution((IpxSolution *)CONCAT44(uVar17,HVar16));
                    if (local_e40 != 0) goto LAB_0047bcd1;
                  }
                  (in_stack_00000008->super_HighsInfoStruct).basis_validity =
                       (uint)((*local_38 & 1) != 0);
                  bVar4 = local_1010 != 2;
                  bVar2 = local_1014 != 2;
                  if (bVar4 && bVar2) {
                    *local_48 = kOptimal;
                  }
                  else {
                    *local_48 = kUnknown;
                  }
                  local_1170 = (HighsStatus)(!bVar4 || !bVar2);
                  local_14 = local_1170;
                  local_e40 = 1;
                }
              }
            }
          }
        }
      }
    }
    else {
      *local_48 = kSolveError;
      local_14 = kError;
      local_e40 = 1;
    }
  }
  else {
    *local_48 = kSolveError;
    local_14 = kError;
    local_e40 = 1;
  }
LAB_0047bcd1:
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)message);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)message);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)message);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)message);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)message);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)message);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)message);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)message);
  ipx::LpSolver::~LpSolver((LpSolver *)CONCAT44(uVar17,HVar16));
  return local_14;
}

Assistant:

HighsStatus solveLpIpx(const HighsOptions& options, HighsTimer& timer,
                       const HighsLp& lp, HighsBasis& highs_basis,
                       HighsSolution& highs_solution,
                       HighsModelStatus& model_status, HighsInfo& highs_info,
                       HighsCallback& callback) {
  // Use IPX to try to solve the LP
  //
  // Can return HighsModelStatus (HighsStatus) values:
  //
  // 1. kSolveError (kError) if various unlikely solution errors occur
  //
  // 2. kTimeLimit (kWarning) if time limit is reached
  //
  // 3. kIterationLimit (kWarning) if iteration limit is reached
  //
  // 4. kUnknown (kWarning) if IPM makes no progress or if
  // IPM/crossover are imprecise
  //
  // 5. kInfeasible (kOk) if IPM identifies primal infeasibility
  //
  // 6. kUnboundedOrInfeasible (kOk) if IPM identifies dual
  // infeasibility
  //
  // kOptimal (kOk) if IPM/crossover identify optimality
  //
  // With a non-error return, if just IPM has been run then a
  // non-vertex primal solution is obtained; if crossover has been run
  // then a basis and primal+dual solution are obtained.
  //
  //
  // Indicate that there is no valid primal solution, dual solution or basis
  highs_basis.valid = false;
  highs_solution.value_valid = false;
  highs_solution.dual_valid = false;
  // Indicate that no imprecise solution has (yet) been found
  resetModelStatusAndHighsInfo(model_status, highs_info);
  // Create the LpSolver instance
  ipx::LpSolver lps;
  // Set IPX parameters
  //
  // Cannot set internal IPX parameters directly since they are
  // private, so create instance of parameters
  ipx::Parameters parameters;
  // Set IPX parameters from options
  //
  // Set display according to output
  parameters.display = 1;
  if (!options.output_flag | !options.log_to_console) parameters.display = 0;
  // Modify parameters.debug according to log_dev_level
  parameters.debug = 0;
  if (options.log_dev_level == kHighsLogDevLevelDetailed) {
    // Default options.log_dev_level setting is kHighsLogDevLevelNone, yielding
    // default setting debug = 0
    parameters.debug = 0;
  } else if (options.log_dev_level == kHighsLogDevLevelInfo) {
    parameters.debug = 2;
  } else if (options.log_dev_level == kHighsLogDevLevelVerbose) {
    parameters.debug = 4;
  }
  parameters.highs_logging = true;
  parameters.timeless_log = options.timeless_log;
  parameters.log_options = &options.log_options;
  // Just test feasibility and optimality tolerances for now
  // ToDo Set more parameters
  //
  // Translate dualization option
  //
  // parameters.dualize = -2 => Possibly dualize - Filippo style
  // parameters.dualize = -1 => Possibly dualize - Lukas style
  // parameters.dualize = 0 => No dualization
  // parameters.dualize = 1 => Perform dualization
  if (options.ipx_dualize_strategy == kIpxDualizeStrategyOn) {
    parameters.dualize = 1;
  } else if (options.ipx_dualize_strategy == kIpxDualizeStrategyOff) {
    parameters.dualize = 0;
  } else if (options.ipx_dualize_strategy == kIpxDualizeStrategyLukas) {
    parameters.dualize = -1;
  } else if (options.ipx_dualize_strategy == kIpxDualizeStrategyFilippo) {
    parameters.dualize = -2;
  } else {
    assert(111 == 222);
  }

  parameters.ipm_feasibility_tol = min(options.primal_feasibility_tolerance,
                                       options.dual_feasibility_tolerance);

  parameters.ipm_optimality_tol = options.ipm_optimality_tolerance;
  parameters.start_crossover_tol = options.start_crossover_tolerance;
  parameters.analyse_basis_data =
      kHighsAnalysisLevelNlaData & options.highs_analysis_level;
  // Determine the run time allowed for IPX
  parameters.time_limit = options.time_limit - timer.read();
  parameters.ipm_maxiter =
      options.ipm_iteration_limit - highs_info.ipm_iteration_count;
  // Determine if crossover is to be run or not
  //
  // When doing analytic centring calculations, crossover must not be
  // run
  if (options.run_centring) {
    parameters.run_crossover = 0;
  } else if (options.run_crossover == kHighsOnString) {
    parameters.run_crossover = 1;
  } else if (options.run_crossover == kHighsOffString) {
    parameters.run_crossover = 0;
  } else {
    assert(options.run_crossover == kHighsChooseString);
    parameters.run_crossover = -1;
  }
  if (!parameters.run_crossover) {
    // If crossover is sure not to be run, then set crossover_start to
    // -1 so that IPX can terminate according to its feasibility and
    // optimality tolerances
    parameters.start_crossover_tol = -1;
  }

  parameters.run_centring = options.run_centring ? 1 : 0;
  parameters.max_centring_steps = options.max_centring_steps;
  parameters.centring_ratio_tolerance = options.centring_ratio_tolerance;

  // Set the internal IPX parameters
  lps.SetParameters(parameters);

  // Set pointer to any callback
  lps.SetCallback(&callback);

  ipx::Int num_col, num_row;
  double offset;
  std::vector<ipx::Int> Ap, Ai;
  std::vector<double> objective, col_lb, col_ub, Av, rhs;
  std::vector<char> constraint_type;
  fillInIpxData(lp, num_col, num_row, offset, objective, col_lb, col_ub, Ap, Ai,
                Av, rhs, constraint_type);
  highsLogUser(options.log_options, HighsLogType::kInfo,
               "IPX model has %" HIGHSINT_FORMAT " rows, %" HIGHSINT_FORMAT
               " columns and %" HIGHSINT_FORMAT " nonzeros\n",
               num_row, num_col, Ap[num_col]);

  ipx::Int load_status = lps.LoadModel(
      num_col, offset, objective.data(), col_lb.data(), col_ub.data(), num_row,
      Ap.data(), Ai.data(), Av.data(), rhs.data(), constraint_type.data());

  if (load_status) {
    model_status = HighsModelStatus::kSolveError;
    return HighsStatus::kError;
  }

  // Use IPX to solve the LP!
  ipx::Int solve_status = lps.Solve();

  const bool report_solve_data =
      kHighsAnalysisLevelSolverSummaryData & options.highs_analysis_level;
  // Get solver and solution information.
  // Struct ipx_info defined in ipx/ipx_info.h
  const ipx::Info ipx_info = lps.GetInfo();
  if (report_solve_data) reportSolveData(options.log_options, ipx_info);
  highs_info.ipm_iteration_count += (HighsInt)ipx_info.iter;
  highs_info.crossover_iteration_count += (HighsInt)ipx_info.updates_crossover;

  // If not solved...
  if (solve_status != IPX_STATUS_solved) {
    const HighsStatus solve_return_status =
        reportIpxSolveStatus(options, solve_status, ipx_info.errflag);
    // Return error if IPX solve error has occurred
    if (solve_return_status == HighsStatus::kError) {
      model_status = HighsModelStatus::kSolveError;
      return HighsStatus::kError;
    }
  }
  bool ipm_status = true;
  const HighsStatus ipm_return_status =
      reportIpxIpmCrossoverStatus(options, ipx_info.status_ipm, ipm_status);
  ipm_status = false;
  const HighsStatus crossover_return_status = reportIpxIpmCrossoverStatus(
      options, ipx_info.status_crossover, ipm_status);
  // Return error if IPX IPM or crossover error has occurred
  if (ipm_return_status == HighsStatus::kError ||
      crossover_return_status == HighsStatus::kError) {
    model_status = HighsModelStatus::kSolveError;
    return HighsStatus::kError;
  }
  // Should only reach here if Solve() returned IPX_STATUS_solved or
  // IPX_STATUS_stopped
  if (ipxStatusError(
          solve_status != IPX_STATUS_solved &&
              solve_status != IPX_STATUS_stopped,
          options, "solve_status should be solved or stopped here but value is",
          (int)solve_status))
    return HighsStatus::kError;

  // Only error returns so far
  //

  if (solve_status == IPX_STATUS_stopped) {
    // IPX stopped, so there's certainly no basic solution. Get the
    // non-vertex solution, though. This needs the model status to
    // know whether to worry about dual infeasibilities.
    const HighsModelStatus local_model_status = HighsModelStatus::kUnknown;
    getHighsNonVertexSolution(options, lp, num_col, num_row, rhs,
                              constraint_type, lps, local_model_status,
                              highs_solution);
    //
    // Look at the reason why IPX stopped
    //
    // Return error if stopped status settings occur that JAJH doesn't
    // think should happen
    //
    //==============
    // For crossover
    //==============
    if (illegalIpxStoppedCrossoverStatus(ipx_info, options))
      return HighsStatus::kError;
    // Can stop and reach time limit
    if (ipx_info.status_crossover == IPX_STATUS_time_limit) {
      model_status = HighsModelStatus::kTimeLimit;
      return HighsStatus::kWarning;
    }
    //========
    // For IPM
    //========
    //
    // Note that IPX can stop with IPM optimal, imprecise,
    // primal_infeas or dual_infeas, due to crossover stopping with
    // time limit, and this is why crossover returns are tested first
    if (illegalIpxStoppedIpmStatus(ipx_info, options))
      return HighsStatus::kError;
    // Can stop with user interrupt
    // Can stop with time limit
    // Can stop with iter limit
    // Can stop with no progress
    if (ipx_info.status_ipm == IPX_STATUS_user_interrupt) {
      model_status = HighsModelStatus::kInterrupt;
      return HighsStatus::kWarning;
    } else if (ipx_info.status_ipm == IPX_STATUS_time_limit) {
      model_status = HighsModelStatus::kTimeLimit;
      return HighsStatus::kWarning;
    } else if (ipx_info.status_ipm == IPX_STATUS_iter_limit) {
      model_status = HighsModelStatus::kIterationLimit;
      return HighsStatus::kWarning;
    } else {
      assert(ipx_info.status_ipm == IPX_STATUS_no_progress);
      reportIpmNoProgress(options, ipx_info);
      model_status = HighsModelStatus::kUnknown;
      return HighsStatus::kWarning;
    }
  }
  // Should only reach here if Solve() returned IPX_STATUS_solved
  if (ipxStatusError(solve_status != IPX_STATUS_solved, options,
                     "solve_status should be solved here but value is",
                     (int)solve_status))
    return HighsStatus::kError;
  // Return error if solved status settings occur that JAJH doesn't
  // think should happen
  if (illegalIpxSolvedStatus(ipx_info, options)) return HighsStatus::kError;
  //==============
  // For crossover
  //==============
  // Can be not run
  // Can solve and be optimal
  // Can solve and be imprecise
  //========
  // For IPM
  //========
  // Can solve and be optimal
  // Can solve and be imprecise
  // Can solve and be primal_infeas
  // Can solve and be dual_infeas
  if (ipx_info.status_ipm == IPX_STATUS_primal_infeas ||
      ipx_info.status_ipm == IPX_STATUS_dual_infeas) {
    // IPM identified primal or dual infeasibility: crossover will not
    // have run, so get the non-vertex solution and return
    if (ipx_info.status_ipm == IPX_STATUS_primal_infeas) {
      model_status = HighsModelStatus::kInfeasible;
    } else if (ipx_info.status_ipm == IPX_STATUS_dual_infeas) {
      model_status = HighsModelStatus::kUnboundedOrInfeasible;
    }
    getHighsNonVertexSolution(options, lp, num_col, num_row, rhs,
                              constraint_type, lps, model_status,
                              highs_solution);
    return HighsStatus::kOk;
  }

  // Should only reach here if IPM is optimal or imprecise
  if (ipxStatusError(ipx_info.status_ipm != IPX_STATUS_optimal &&
                         ipx_info.status_ipm != IPX_STATUS_imprecise,
                     options,
                     "ipm status should be not run, optimal or imprecise "
                     "but value is",
                     (int)ipx_info.status_ipm))
    return HighsStatus::kError;

  // Should only reach here if crossover is not run, optimal or imprecise
  if (ipxStatusError(ipx_info.status_crossover != IPX_STATUS_not_run &&
                         ipx_info.status_crossover != IPX_STATUS_optimal &&
                         ipx_info.status_crossover != IPX_STATUS_imprecise,
                     options,
                     "crossover status should be not run, optimal or imprecise "
                     "but value is",
                     (int)ipx_info.status_crossover))
    return HighsStatus::kError;

  // Basic solution depends on crossover being run
  const bool have_basic_solution =
      ipx_info.status_crossover != IPX_STATUS_not_run;
  // Both crossover and IPM can be imprecise
  const bool imprecise_solution =
      ipx_info.status_crossover == IPX_STATUS_imprecise ||
      ipx_info.status_ipm == IPX_STATUS_imprecise;
  if (have_basic_solution) {
    IpxSolution ipx_solution;
    ipx_solution.num_col = num_col;
    ipx_solution.num_row = num_row;
    ipx_solution.ipx_col_value.resize(num_col);
    ipx_solution.ipx_row_value.resize(num_row);
    ipx_solution.ipx_col_dual.resize(num_col);
    ipx_solution.ipx_row_dual.resize(num_row);
    ipx_solution.ipx_row_status.resize(num_row);
    ipx_solution.ipx_col_status.resize(num_col);
    ipx::Int errflag = lps.GetBasicSolution(
        ipx_solution.ipx_col_value.data(), ipx_solution.ipx_row_value.data(),
        ipx_solution.ipx_row_dual.data(), ipx_solution.ipx_col_dual.data(),
        ipx_solution.ipx_row_status.data(), ipx_solution.ipx_col_status.data());
    if (errflag != 0) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "IPX crossover getting basic solution: flag = %d\n",
                   (int)errflag);
      return HighsStatus::kError;
    }
    // Convert the IPX basic solution to a HiGHS basic solution
    HighsStatus status = ipxBasicSolutionToHighsBasicSolution(
        options.log_options, lp, rhs, constraint_type, ipx_solution,
        highs_basis, highs_solution);
    if (status != HighsStatus::kOk) {
      highsLogUser(
          options.log_options, HighsLogType::kError,
          "Failed to convert IPX basic solution to Highs basic solution\n");
      return HighsStatus::kError;
    }

  } else {
    // No basic solution, so get a non-vertex HiGHS solution. This
    // needs the model status to know whether to worry about dual
    // infeasibilities.
    const HighsModelStatus local_model_status =
        imprecise_solution ? HighsModelStatus::kUnknown
                           : HighsModelStatus::kOptimal;
    getHighsNonVertexSolution(options, lp, num_col, num_row, rhs,
                              constraint_type, lps, local_model_status,
                              highs_solution);
    assert(!highs_basis.valid);
  }
  highs_info.basis_validity =
      highs_basis.valid ? kBasisValidityValid : kBasisValidityInvalid;
  HighsStatus return_status;
  if (imprecise_solution) {
    model_status = HighsModelStatus::kUnknown;
    return_status = HighsStatus::kWarning;
  } else {
    model_status = HighsModelStatus::kOptimal;
    return_status = HighsStatus::kOk;
  }
  return return_status;
}